

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O1

void * aura_node_eventloop_get_autocreate(aura_node *node)

{
  aura_eventloop *paVar1;
  
  paVar1 = node->loop;
  if (paVar1 == (aura_eventloop *)0x0) {
    slog(3,4,"aura: Auto-creating eventsystem for node");
    paVar1 = (aura_eventloop *)aura_eventloop_create__(0,node,0);
    if (paVar1 == (aura_eventloop *)0x0) {
      slog(0,5,"aura: eventloop auto-creation failed");
      aura_panic(node);
    }
    node->evtloop_is_autocreated = 1;
    node->loop = paVar1;
  }
  return paVar1;
}

Assistant:

void *aura_node_eventloop_get_autocreate(struct aura_node *node)
{
	struct aura_eventloop *loop = aura_node_eventloop_get(node);

	if (loop == NULL) {
		slog(3, SLOG_DEBUG, "aura: Auto-creating eventsystem for node");
		loop = aura_eventloop_create(node);
		if (!loop) {
			slog(0, SLOG_ERROR, "aura: eventloop auto-creation failed");
			aura_panic(node);
		}
		node->evtloop_is_autocreated = 1;
		aura_node_eventloop_set(node, loop);
	}
	return loop;
}